

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kazsignal.h
# Opt level: O3

int __thiscall
sig::ProtoSignal<void_()>::connect
          (ProtoSignal<void_()> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined4 in_register_00000034;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  _Any_data local_60;
  code *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  LOCK();
  *(long *)(lVar2 + 8) = *(long *)(lVar2 + 8) + 1;
  UNLOCK();
  pp_Var1 = *(_func_int ***)(lVar2 + 8);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00107d28;
  this_00[1]._vptr__Sp_counted_base = pp_Var1;
  this_00[1]._M_use_count = __fd;
  this_00[1]._M_weak_count = in_register_00000034;
  std::function<void_()>::function((function<void_()> *)&local_60,(function<void_()> *)__addr);
  p_Var3 = this_00 + 1;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = 2;
  }
  local_40 = p_Var3;
  local_38 = this_00;
  threadsafe::ring_buffer<sig::ProtoSignal<void_()>::Link>::push_back
            ((ring_buffer<sig::ProtoSignal<void_()>::Link> *)(lVar2 + 0x10),(value_type *)&local_60)
  ;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar4 = __libc_single_threaded == '\0';
    (this->super_Disconnector)._vptr_Disconnector = (_func_int **)p_Var3;
    (this->connection_counter_).super___atomic_base<unsigned_long>._M_i = (__int_type)this_00;
    if (bVar4) {
      LOCK();
      this_00->_M_weak_count = this_00->_M_weak_count + 1;
      UNLOCK();
      goto LAB_00103727;
    }
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (this->super_Disconnector)._vptr_Disconnector = (_func_int **)p_Var3;
    (this->connection_counter_).super___atomic_base<unsigned_long>._M_i = (__int_type)this_00;
  }
  this_00->_M_weak_count = this_00->_M_weak_count + 1;
LAB_00103727:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return (int)this;
}

Assistant:

Connection connect(const callback& func) {
        size_t id = increment_counter();
        auto conn_impl = std::make_shared<ConnectionImpl>(this, id);
        links_.push_back({func, conn_impl});
        return Connection(conn_impl);
    }